

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::python::NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
          (string *__return_storage_ptr__,python *this,Descriptor *descriptor,string_view separator)

{
  long lVar1;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  char *pcVar5;
  size_type __rlen;
  string_view separator_00;
  string_view name_00;
  string name;
  string prefix;
  char *local_118;
  python *local_110;
  char local_108;
  undefined7 uStack_107;
  undefined8 uStack_100;
  string local_f8;
  undefined1 local_d8 [32];
  char local_b8 [8];
  char *local_b0;
  python *local_a8;
  char *local_a0;
  undefined8 local_98;
  char *local_90;
  python *local_88;
  char *local_80;
  AlphaNum local_58;
  
  pcVar5 = separator._M_str;
  separator_00._M_len = (char *)separator._M_len;
  lVar1 = **(long **)(this + 8);
  pcVar4 = separator_00._M_len;
  local_118 = &local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,lVar1,(*(long **)(this + 8))[1] + lVar1);
  if (*(python **)(this + 0x18) == (python *)0x0) {
    if (descriptor == (Descriptor *)0x1) {
      iVar2 = bcmp(separator_00._M_len,".",1);
      if (iVar2 == 0) {
        name_00._M_str = pcVar4;
        name_00._M_len = (size_t)local_118;
        ResolveKeyword_abi_cxx11_((string *)local_d8,local_110,name_00);
        std::__cxx11::string::operator=((string *)&local_118,(string *)local_d8);
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_118 == &local_108) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_107,local_108);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_100;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_118;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_107,local_108);
    }
    __return_storage_ptr__->_M_string_length = (size_type)local_110;
    local_110 = (python *)0x0;
    local_108 = '\0';
    local_118 = &local_108;
    goto LAB_0030f046;
  }
  separator_00._M_str = pcVar5;
  NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (&local_f8,*(python **)(this + 0x18),descriptor,separator_00);
  if (descriptor == (Descriptor *)0x1) {
    iVar2 = bcmp(separator_00._M_len,".",1);
    if (iVar2 != 0) goto LAB_0030ef43;
    local_d8._0_8_ = local_110;
    local_d8._8_8_ = local_118;
    ppcVar3 = std::
              __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                        (kKeywords,kKeywordsEnd);
    if (ppcVar3 == (char **)kKeywordsEnd) goto LAB_0030ef43;
    local_d8._0_8_ = &DAT_00000008;
    local_d8._8_8_ = "getattr(";
    local_d8._16_8_ = local_f8._M_string_length;
    local_d8._24_8_ = local_f8._M_dataplus._M_p;
    local_b8[0] = '\x03';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b0 = ", \'";
    local_a8 = local_110;
    local_a0 = local_118;
    local_98 = 2;
    local_90 = "\')";
    absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(__return_storage_ptr__,local_d8,5);
  }
  else {
LAB_0030ef43:
    local_d8._0_8_ = local_f8._M_string_length;
    local_d8._8_8_ = local_f8._M_dataplus._M_p;
    local_88 = local_110;
    local_80 = local_118;
    local_58.piece_._M_len = (size_t)descriptor;
    local_58.piece_._M_str = separator_00._M_len;
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)__return_storage_ptr__,(AlphaNum *)local_d8,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
LAB_0030f046:
  if (local_118 != &local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NamePrefixedWithNestedTypes(const DescriptorT& descriptor,
                                        absl::string_view separator) {
  std::string name = std::string(descriptor.name());
  const Descriptor* parent = descriptor.containing_type();
  if (parent != nullptr) {
    std::string prefix = NamePrefixedWithNestedTypes(*parent, separator);
    if (separator == "." && IsPythonKeyword(name)) {
      return absl::StrCat("getattr(", prefix, ", '", name, "')");
    } else {
      return absl::StrCat(prefix, separator, name);
    }
  }
  if (separator == ".") {
    name = ResolveKeyword(name);
  }
  return name;
}